

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O3

int Android420ToARGBMatrix
              (uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
              int src_stride_v,int src_pixel_stride_uv,uint8_t *dst_argb,int dst_stride_argb,
              YuvConstants *yuvconstants,int width,int height)

{
  int iVar1;
  void *__ptr;
  uint8_t *src_uv;
  uint src_stride_uv;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *puVar6;
  long lVar7;
  undefined1 auVar8 [16];
  
  auVar8._0_4_ = -(uint)(src_y == (uint8_t *)0x0);
  auVar8._4_4_ = -(uint)(src_u == (uint8_t *)0x0);
  auVar8._8_4_ = -(uint)(src_v == (uint8_t *)0x0);
  auVar8._12_4_ = -(uint)(dst_argb == (uint8_t *)0x0);
  iVar2 = movmskps((int)src_u,auVar8);
  iVar1 = -1;
  if ((height != 0 && 0 < width) && iVar2 == 0) {
    if (height < 0) {
      iVar1 = -height;
      uVar4 = 1U - height >> 1;
      dst_argb = dst_argb + ~height * dst_stride_argb;
      dst_stride_argb = -dst_stride_argb;
    }
    else {
      uVar4 = height + 1 >> 1;
      iVar1 = height;
    }
    if (src_pixel_stride_uv == 1) {
      iVar1 = I420ToARGBMatrix(src_y,src_stride_y,src_u,src_stride_u,src_v,src_stride_v,dst_argb,
                               dst_stride_argb,yuvconstants,width,iVar1);
    }
    else if (((src_stride_u == src_stride_v) && (src_pixel_stride_uv == 2)) &&
            ((long)src_v - (long)src_u == -1)) {
      iVar1 = NV21ToARGBMatrix(src_y,src_stride_y,src_v,src_stride_u,dst_argb,dst_stride_argb,
                               yuvconstants,width,iVar1);
    }
    else if (((src_stride_u == src_stride_v) && (src_pixel_stride_uv == 2)) &&
            ((long)src_v - (long)src_u == 1)) {
      iVar1 = NV12ToARGBMatrix(src_y,src_stride_y,src_u,src_stride_u,dst_argb,dst_stride_argb,
                               yuvconstants,width,iVar1);
    }
    else {
      src_stride_uv = width + 1U & 0x7ffffffe;
      __ptr = malloc((long)(int)(uVar4 * src_stride_uv + 0x3f));
      src_uv = (uint8_t *)((long)__ptr + 0x3fU & 0xffffffffffffffc0);
      if (0 < (int)uVar4) {
        iVar2 = (int)(width + 1U) >> 1;
        uVar5 = 0;
        puVar6 = src_uv;
        do {
          if (0 < iVar2) {
            lVar7 = 0;
            lVar3 = 0;
            do {
              puVar6[lVar3 * 2] = src_u[lVar7];
              puVar6[lVar3 * 2 + 1] = src_v[lVar7];
              lVar3 = lVar3 + 1;
              lVar7 = lVar7 + src_pixel_stride_uv;
            } while (iVar2 != (int)lVar3);
          }
          src_u = src_u + src_stride_u;
          src_v = src_v + src_stride_v;
          puVar6 = puVar6 + src_stride_uv;
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar4);
      }
      NV12ToARGBMatrix(src_y,src_stride_y,src_uv,src_stride_uv,dst_argb,dst_stride_argb,yuvconstants
                       ,width,iVar1);
      free(__ptr);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int Android420ToARGBMatrix(const uint8_t* src_y,
                           int src_stride_y,
                           const uint8_t* src_u,
                           int src_stride_u,
                           const uint8_t* src_v,
                           int src_stride_v,
                           int src_pixel_stride_uv,
                           uint8_t* dst_argb,
                           int dst_stride_argb,
                           const struct YuvConstants* yuvconstants,
                           int width,
                           int height) {
  int y;
  uint8_t* dst_uv;
  const ptrdiff_t vu_off = src_v - src_u;
  int halfwidth = (width + 1) >> 1;
  int halfheight = (height + 1) >> 1;
  if (!src_y || !src_u || !src_v || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    halfheight = (height + 1) >> 1;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }

  // I420
  if (src_pixel_stride_uv == 1) {
    return I420ToARGBMatrix(src_y, src_stride_y, src_u, src_stride_u, src_v,
                            src_stride_v, dst_argb, dst_stride_argb,
                            yuvconstants, width, height);
    // NV21
  }
  if (src_pixel_stride_uv == 2 && vu_off == -1 &&
      src_stride_u == src_stride_v) {
    return NV21ToARGBMatrix(src_y, src_stride_y, src_v, src_stride_v, dst_argb,
                            dst_stride_argb, yuvconstants, width, height);
    // NV12
  }
  if (src_pixel_stride_uv == 2 && vu_off == 1 && src_stride_u == src_stride_v) {
    return NV12ToARGBMatrix(src_y, src_stride_y, src_u, src_stride_u, dst_argb,
                            dst_stride_argb, yuvconstants, width, height);
  }

  // General case fallback creates NV12
  align_buffer_64(plane_uv, halfwidth * 2 * halfheight);
  dst_uv = plane_uv;
  for (y = 0; y < halfheight; ++y) {
    WeavePixels(src_u, src_v, src_pixel_stride_uv, dst_uv, halfwidth);
    src_u += src_stride_u;
    src_v += src_stride_v;
    dst_uv += halfwidth * 2;
  }
  NV12ToARGBMatrix(src_y, src_stride_y, plane_uv, halfwidth * 2, dst_argb,
                   dst_stride_argb, yuvconstants, width, height);
  free_aligned_buffer_64(plane_uv);
  return 0;
}